

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O3

DdNode * Cudd_addXeqy(DdManager *dd,int N,DdNode **x,DdNode **y)

{
  int *piVar1;
  DdNode *h;
  bool bVar2;
  DdNode *g;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *h_00;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  pDVar3 = dd->one;
  h = dd->zero;
  g = Cudd_addIte(dd,y[(long)N + -1],pDVar3,h);
  if (g != (DdNode *)0x0) {
    lVar7 = (long)N + -1;
    piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar3 = Cudd_addIte(dd,y[lVar7],h,pDVar3);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar4 = Cudd_addIte(dd,x[lVar7],g,pDVar3);
      if (pDVar4 != (DdNode *)0x0) {
        uVar5 = (ulong)pDVar4 & 0xfffffffffffffffe;
        *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
        Cudd_RecursiveDeref(dd,g);
        Cudd_RecursiveDeref(dd,pDVar3);
        if (1 < N) {
          lVar7 = (ulong)(N - 2) + 1;
          g = pDVar4;
          do {
            pDVar3 = Cudd_addIte(dd,y[lVar7 + -1],g,h);
            if (pDVar3 == (DdNode *)0x0) goto LAB_0078f446;
            piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            h_00 = Cudd_addIte(dd,y[lVar7 + -1],h,g);
            if (h_00 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,g);
              g = pDVar3;
              goto LAB_0078f446;
            }
            piVar1 = (int *)(((ulong)h_00 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,g);
            pDVar4 = Cudd_addIte(dd,x[lVar7 + -1],pDVar3,h_00);
            uVar5 = (ulong)pDVar4 & 0xfffffffffffffffe;
            *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
            Cudd_RecursiveDeref(dd,pDVar3);
            Cudd_RecursiveDeref(dd,h_00);
            lVar6 = lVar7 + -1;
            bVar2 = 0 < lVar7;
            lVar7 = lVar6;
            g = pDVar4;
          } while (lVar6 != 0 && bVar2);
        }
        *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + -1;
        return pDVar4;
      }
      Cudd_RecursiveDeref(dd,g);
      g = pDVar3;
    }
LAB_0078f446:
    Cudd_RecursiveDeref(dd,g);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addXeqy(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    DdNode *one, *zero;
    DdNode *u, *v, *w;
    int     i;

    one = DD_ONE(dd);
    zero = DD_ZERO(dd);

    /* Build bottom part of ADD outside loop. */
    v = Cudd_addIte(dd, y[N-1], one, zero);
    if (v == NULL) return(NULL);
    cuddRef(v);
    w = Cudd_addIte(dd, y[N-1], zero, one);
    if (w == NULL) {
        Cudd_RecursiveDeref(dd, v);
        return(NULL);
    }
    cuddRef(w);
    u = Cudd_addIte(dd, x[N-1], v, w);
    if (u == NULL) {
        Cudd_RecursiveDeref(dd, v);
        Cudd_RecursiveDeref(dd, w);
        return(NULL);
    }
    cuddRef(u);
    Cudd_RecursiveDeref(dd, v);
    Cudd_RecursiveDeref(dd, w);

    /* Loop to build the rest of the ADD. */
    for (i = N-2; i >= 0; i--) {
        v = Cudd_addIte(dd, y[i], u, zero);
        if (v == NULL) {
            Cudd_RecursiveDeref(dd, u);
            return(NULL);
        }
        cuddRef(v);
        w = Cudd_addIte(dd, y[i], zero, u);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, u);
            Cudd_RecursiveDeref(dd, v);
            return(NULL);
        }
        cuddRef(w);
        Cudd_RecursiveDeref(dd, u);
        u = Cudd_addIte(dd, x[i], v, w);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, v);
            Cudd_RecursiveDeref(dd, w);
            return(NULL);
        }
        cuddRef(u);
        Cudd_RecursiveDeref(dd, v);
        Cudd_RecursiveDeref(dd, w);
    }
    cuddDeref(u);
    return(u);

}